

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void VFilter16i_SSE2(uint8_t *p,int stride,int thresh,int ithresh,int hev_thresh)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  undefined1 auVar25 [16];
  byte bVar40;
  __m128i p0;
  __m128i p1;
  __m128i local_88;
  __m128i local_78;
  __m128i local_68;
  __m128i local_58;
  byte local_48;
  byte bStack_47;
  byte bStack_46;
  byte bStack_45;
  byte bStack_44;
  byte bStack_43;
  byte bStack_42;
  byte bStack_41;
  byte bStack_40;
  byte bStack_3f;
  byte bStack_3e;
  byte bStack_3d;
  byte bStack_3c;
  byte bStack_3b;
  byte bStack_3a;
  byte bStack_39;
  
  local_78 = *(__m128i *)p;
  lVar3 = (long)stride;
  local_88 = *(__m128i *)(p + lVar3);
  p1 = *(__m128i *)(p + lVar3 * 2);
  lVar1 = lVar3 * 3;
  p0 = *(__m128i *)(p + lVar1);
  lVar4 = (long)(stride * 4);
  for (iVar2 = -3; iVar2 != 0; iVar2 = iVar2 + 1) {
    auVar23 = psubusb((undefined1  [16])p1,(undefined1  [16])p0);
    auVar25 = psubusb((undefined1  [16])p0,(undefined1  [16])p1);
    auVar25 = auVar25 | auVar23;
    auVar24 = psubusb((undefined1  [16])local_88,(undefined1  [16])local_78);
    auVar23 = psubusb((undefined1  [16])local_78,(undefined1  [16])local_88);
    auVar23 = auVar23 | auVar24;
    bVar5 = auVar25[0];
    bVar7 = auVar23[0];
    bVar7 = (bVar7 < bVar5) * bVar5 | (bVar7 >= bVar5) * bVar7;
    bVar5 = auVar25[1];
    bVar8 = auVar23[1];
    bVar8 = (bVar8 < bVar5) * bVar5 | (bVar8 >= bVar5) * bVar8;
    bVar5 = auVar25[2];
    bVar9 = auVar23[2];
    bVar9 = (bVar9 < bVar5) * bVar5 | (bVar9 >= bVar5) * bVar9;
    bVar5 = auVar25[3];
    bVar10 = auVar23[3];
    bVar10 = (bVar10 < bVar5) * bVar5 | (bVar10 >= bVar5) * bVar10;
    bVar5 = auVar25[4];
    bVar11 = auVar23[4];
    bVar11 = (bVar11 < bVar5) * bVar5 | (bVar11 >= bVar5) * bVar11;
    bVar5 = auVar25[5];
    bVar12 = auVar23[5];
    bVar12 = (bVar12 < bVar5) * bVar5 | (bVar12 >= bVar5) * bVar12;
    bVar5 = auVar25[6];
    bVar13 = auVar23[6];
    bVar13 = (bVar13 < bVar5) * bVar5 | (bVar13 >= bVar5) * bVar13;
    bVar5 = auVar25[7];
    bVar14 = auVar23[7];
    bVar14 = (bVar14 < bVar5) * bVar5 | (bVar14 >= bVar5) * bVar14;
    bVar5 = auVar25[8];
    bVar15 = auVar23[8];
    bVar15 = (bVar15 < bVar5) * bVar5 | (bVar15 >= bVar5) * bVar15;
    bVar5 = auVar25[9];
    bVar16 = auVar23[9];
    bVar16 = (bVar16 < bVar5) * bVar5 | (bVar16 >= bVar5) * bVar16;
    bVar5 = auVar25[10];
    bVar17 = auVar23[10];
    bVar17 = (bVar17 < bVar5) * bVar5 | (bVar17 >= bVar5) * bVar17;
    bVar5 = auVar25[0xb];
    bVar18 = auVar23[0xb];
    bVar18 = (bVar18 < bVar5) * bVar5 | (bVar18 >= bVar5) * bVar18;
    bVar5 = auVar25[0xc];
    bVar19 = auVar23[0xc];
    bVar19 = (bVar19 < bVar5) * bVar5 | (bVar19 >= bVar5) * bVar19;
    bVar5 = auVar25[0xd];
    bVar20 = auVar23[0xd];
    bVar20 = (bVar20 < bVar5) * bVar5 | (bVar20 >= bVar5) * bVar20;
    bVar5 = auVar25[0xe];
    bVar6 = auVar23[0xe];
    bVar22 = auVar23[0xf];
    bVar21 = (bVar6 < bVar5) * bVar5 | (bVar6 >= bVar5) * bVar6;
    bVar5 = auVar25[0xf];
    bVar22 = (bVar22 < bVar5) * bVar5 | (bVar22 >= bVar5) * bVar22;
    auVar24 = psubusb((undefined1  [16])p1,(undefined1  [16])local_88);
    auVar23 = psubusb((undefined1  [16])local_88,(undefined1  [16])p1);
    auVar23 = auVar23 | auVar24;
    bVar5 = auVar23[0];
    bVar5 = (bVar5 < bVar7) * bVar7 | (bVar5 >= bVar7) * bVar5;
    bVar7 = auVar23[1];
    bVar7 = (bVar7 < bVar8) * bVar8 | (bVar7 >= bVar8) * bVar7;
    bVar8 = auVar23[2];
    bVar8 = (bVar8 < bVar9) * bVar9 | (bVar8 >= bVar9) * bVar8;
    bVar9 = auVar23[3];
    bVar9 = (bVar9 < bVar10) * bVar10 | (bVar9 >= bVar10) * bVar9;
    bVar10 = auVar23[4];
    bVar10 = (bVar10 < bVar11) * bVar11 | (bVar10 >= bVar11) * bVar10;
    bVar11 = auVar23[5];
    bVar11 = (bVar11 < bVar12) * bVar12 | (bVar11 >= bVar12) * bVar11;
    bVar12 = auVar23[6];
    bVar12 = (bVar12 < bVar13) * bVar13 | (bVar12 >= bVar13) * bVar12;
    bVar13 = auVar23[7];
    bVar13 = (bVar13 < bVar14) * bVar14 | (bVar13 >= bVar14) * bVar13;
    bVar14 = auVar23[8];
    bVar14 = (bVar14 < bVar15) * bVar15 | (bVar14 >= bVar15) * bVar14;
    bVar15 = auVar23[9];
    bVar15 = (bVar15 < bVar16) * bVar16 | (bVar15 >= bVar16) * bVar15;
    bVar16 = auVar23[10];
    bVar16 = (bVar16 < bVar17) * bVar17 | (bVar16 >= bVar17) * bVar16;
    bVar17 = auVar23[0xb];
    bVar17 = (bVar17 < bVar18) * bVar18 | (bVar17 >= bVar18) * bVar17;
    bVar18 = auVar23[0xc];
    bVar18 = (bVar18 < bVar19) * bVar19 | (bVar18 >= bVar19) * bVar18;
    bVar19 = auVar23[0xd];
    bVar19 = (bVar19 < bVar20) * bVar20 | (bVar19 >= bVar20) * bVar19;
    bVar20 = auVar23[0xe];
    bVar6 = auVar23[0xf];
    bVar20 = (bVar20 < bVar21) * bVar21 | (bVar20 >= bVar21) * bVar20;
    bVar6 = (bVar6 < bVar22) * bVar22 | (bVar6 >= bVar22) * bVar6;
    local_78 = *(__m128i *)(p + lVar4);
    local_88 = *(__m128i *)(p + lVar3 + lVar4);
    local_68 = *(__m128i *)(p + lVar4 + lVar3 * 2);
    local_58 = *(__m128i *)(p + lVar4 + lVar1);
    auVar23 = psubusb((undefined1  [16])local_58,(undefined1  [16])local_68);
    auVar24 = psubusb((undefined1  [16])local_68,(undefined1  [16])local_58);
    auVar24 = auVar24 | auVar23;
    bVar21 = auVar24[0];
    bVar22 = (bVar21 < bVar5) * bVar5 | (bVar21 >= bVar5) * bVar21;
    bVar5 = auVar24[1];
    bVar26 = (bVar5 < bVar7) * bVar7 | (bVar5 >= bVar7) * bVar5;
    bVar5 = auVar24[2];
    bVar27 = (bVar5 < bVar8) * bVar8 | (bVar5 >= bVar8) * bVar5;
    bVar5 = auVar24[3];
    bVar28 = (bVar5 < bVar9) * bVar9 | (bVar5 >= bVar9) * bVar5;
    bVar5 = auVar24[4];
    bVar29 = (bVar5 < bVar10) * bVar10 | (bVar5 >= bVar10) * bVar5;
    bVar5 = auVar24[5];
    bVar30 = (bVar5 < bVar11) * bVar11 | (bVar5 >= bVar11) * bVar5;
    bVar5 = auVar24[6];
    bVar31 = (bVar5 < bVar12) * bVar12 | (bVar5 >= bVar12) * bVar5;
    bVar5 = auVar24[7];
    bVar32 = (bVar5 < bVar13) * bVar13 | (bVar5 >= bVar13) * bVar5;
    bVar5 = auVar24[8];
    bVar33 = (bVar5 < bVar14) * bVar14 | (bVar5 >= bVar14) * bVar5;
    bVar5 = auVar24[9];
    bVar34 = (bVar5 < bVar15) * bVar15 | (bVar5 >= bVar15) * bVar5;
    bVar5 = auVar24[10];
    bVar35 = (bVar5 < bVar16) * bVar16 | (bVar5 >= bVar16) * bVar5;
    bVar5 = auVar24[0xb];
    bVar36 = (bVar5 < bVar17) * bVar17 | (bVar5 >= bVar17) * bVar5;
    bVar5 = auVar24[0xc];
    bVar37 = (bVar5 < bVar18) * bVar18 | (bVar5 >= bVar18) * bVar5;
    bVar5 = auVar24[0xd];
    bVar38 = (bVar5 < bVar19) * bVar19 | (bVar5 >= bVar19) * bVar5;
    bVar5 = auVar24[0xe];
    bVar7 = auVar24[0xf];
    bVar39 = (bVar5 < bVar20) * bVar20 | (bVar5 >= bVar20) * bVar5;
    bVar40 = (bVar7 < bVar6) * bVar6 | (bVar7 >= bVar6) * bVar7;
    auVar23 = psubusb((undefined1  [16])local_88,(undefined1  [16])local_78);
    auVar24 = psubusb((undefined1  [16])local_78,(undefined1  [16])local_88);
    auVar24 = auVar24 | auVar23;
    auVar23 = psubusb((undefined1  [16])local_68,(undefined1  [16])local_88);
    auVar25 = psubusb((undefined1  [16])local_88,(undefined1  [16])local_68);
    auVar25 = auVar25 | auVar23;
    bVar5 = auVar24[0];
    bVar7 = auVar25[0];
    bVar7 = (bVar7 < bVar5) * bVar5 | (bVar7 >= bVar5) * bVar7;
    bVar5 = auVar24[1];
    bVar8 = auVar25[1];
    bVar8 = (bVar8 < bVar5) * bVar5 | (bVar8 >= bVar5) * bVar8;
    bVar5 = auVar24[2];
    bVar9 = auVar25[2];
    bVar9 = (bVar9 < bVar5) * bVar5 | (bVar9 >= bVar5) * bVar9;
    bVar5 = auVar24[3];
    bVar10 = auVar25[3];
    bVar10 = (bVar10 < bVar5) * bVar5 | (bVar10 >= bVar5) * bVar10;
    bVar5 = auVar24[4];
    bVar11 = auVar25[4];
    bVar11 = (bVar11 < bVar5) * bVar5 | (bVar11 >= bVar5) * bVar11;
    bVar5 = auVar24[5];
    bVar12 = auVar25[5];
    bVar12 = (bVar12 < bVar5) * bVar5 | (bVar12 >= bVar5) * bVar12;
    bVar5 = auVar24[6];
    bVar13 = auVar25[6];
    bVar13 = (bVar13 < bVar5) * bVar5 | (bVar13 >= bVar5) * bVar13;
    bVar5 = auVar24[7];
    bVar14 = auVar25[7];
    bVar14 = (bVar14 < bVar5) * bVar5 | (bVar14 >= bVar5) * bVar14;
    bVar5 = auVar24[8];
    bVar15 = auVar25[8];
    bVar15 = (bVar15 < bVar5) * bVar5 | (bVar15 >= bVar5) * bVar15;
    bVar5 = auVar24[9];
    bVar16 = auVar25[9];
    bVar16 = (bVar16 < bVar5) * bVar5 | (bVar16 >= bVar5) * bVar16;
    bVar5 = auVar24[10];
    bVar17 = auVar25[10];
    bVar17 = (bVar17 < bVar5) * bVar5 | (bVar17 >= bVar5) * bVar17;
    bVar5 = auVar24[0xb];
    bVar18 = auVar25[0xb];
    bVar18 = (bVar18 < bVar5) * bVar5 | (bVar18 >= bVar5) * bVar18;
    bVar5 = auVar24[0xc];
    bVar19 = auVar25[0xc];
    bVar19 = (bVar19 < bVar5) * bVar5 | (bVar19 >= bVar5) * bVar19;
    bVar5 = auVar24[0xd];
    bVar20 = auVar25[0xd];
    bVar20 = (bVar20 < bVar5) * bVar5 | (bVar20 >= bVar5) * bVar20;
    bVar5 = auVar24[0xe];
    bVar6 = auVar25[0xe];
    bVar21 = auVar25[0xf];
    bVar6 = (bVar6 < bVar5) * bVar5 | (bVar6 >= bVar5) * bVar6;
    bVar5 = auVar24[0xf];
    bVar5 = (bVar21 < bVar5) * bVar5 | (bVar21 >= bVar5) * bVar21;
    local_48 = (bVar7 < bVar22) * bVar22 | (bVar7 >= bVar22) * bVar7;
    bStack_47 = (bVar8 < bVar26) * bVar26 | (bVar8 >= bVar26) * bVar8;
    bStack_46 = (bVar9 < bVar27) * bVar27 | (bVar9 >= bVar27) * bVar9;
    bStack_45 = (bVar10 < bVar28) * bVar28 | (bVar10 >= bVar28) * bVar10;
    bStack_44 = (bVar11 < bVar29) * bVar29 | (bVar11 >= bVar29) * bVar11;
    bStack_43 = (bVar12 < bVar30) * bVar30 | (bVar12 >= bVar30) * bVar12;
    bStack_42 = (bVar13 < bVar31) * bVar31 | (bVar13 >= bVar31) * bVar13;
    bStack_41 = (bVar14 < bVar32) * bVar32 | (bVar14 >= bVar32) * bVar14;
    bStack_40 = (bVar15 < bVar33) * bVar33 | (bVar15 >= bVar33) * bVar15;
    bStack_3f = (bVar16 < bVar34) * bVar34 | (bVar16 >= bVar34) * bVar16;
    bStack_3e = (bVar17 < bVar35) * bVar35 | (bVar17 >= bVar35) * bVar17;
    bStack_3d = (bVar18 < bVar36) * bVar36 | (bVar18 >= bVar36) * bVar18;
    bStack_3c = (bVar19 < bVar37) * bVar37 | (bVar19 >= bVar37) * bVar19;
    bStack_3b = (bVar20 < bVar38) * bVar38 | (bVar20 >= bVar38) * bVar20;
    bStack_3a = (bVar6 < bVar39) * bVar39 | (bVar6 >= bVar39) * bVar6;
    bStack_39 = (bVar5 < bVar40) * bVar40 | (bVar5 >= bVar40) * bVar5;
    ComplexMask_SSE2(&p1,&p0,&local_78,&local_88,thresh,ithresh,(__m128i *)&local_48);
    DoFilter4_SSE2(&p1,&p0,&local_78,&local_88,(__m128i *)&local_48,hev_thresh);
    *(longlong *)(p + lVar3 * 2) = p1[0];
    *(longlong *)((long)(p + lVar3 * 2) + 8) = p1[1];
    *(longlong *)(p + lVar1) = p0[0];
    *(longlong *)((long)(p + lVar1) + 8) = p0[1];
    *(__m128i *)(p + lVar3 * 4) = local_78;
    *(__m128i *)(p + lVar3 * 5) = local_88;
    p1[0] = local_68[0];
    p1[1] = local_68[1];
    p0[0] = local_58[0];
    p0[1] = local_58[1];
    p = p + lVar4;
  }
  return;
}

Assistant:

static void VFilter16i_SSE2(uint8_t* p, int stride,
                            int thresh, int ithresh, int hev_thresh) {
  int k;
  __m128i p3, p2, p1, p0;   // loop invariants

  LOAD_H_EDGES4(p, stride, p3, p2, p1, p0);  // prologue

  for (k = 3; k > 0; --k) {
    __m128i mask, tmp1, tmp2;
    uint8_t* const b = p + 2 * stride;   // beginning of p1
    p += 4 * stride;

    MAX_DIFF1(p3, p2, p1, p0, mask);   // compute partial mask
    LOAD_H_EDGES4(p, stride, p3, p2, tmp1, tmp2);
    MAX_DIFF2(p3, p2, tmp1, tmp2, mask);

    // p3 and p2 are not just temporary variables here: they will be
    // re-used for next span. And q2/q3 will become p1/p0 accordingly.
    ComplexMask_SSE2(&p1, &p0, &p3, &p2, thresh, ithresh, &mask);
    DoFilter4_SSE2(&p1, &p0, &p3, &p2, &mask, hev_thresh);

    // Store
    _mm_storeu_si128((__m128i*)&b[0 * stride], p1);
    _mm_storeu_si128((__m128i*)&b[1 * stride], p0);
    _mm_storeu_si128((__m128i*)&b[2 * stride], p3);
    _mm_storeu_si128((__m128i*)&b[3 * stride], p2);

    // rotate samples
    p1 = tmp1;
    p0 = tmp2;
  }
}